

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointBeliefSparse.cpp
# Opt level: O2

double __thiscall
JointBeliefSparse::UpdateSlow
          (JointBeliefSparse *this,MultiAgentDecisionProcessDiscreteInterface *pu,Index lastJAI,
          Index newJOI)

{
  undefined1 auVar1 [16];
  pointer pdVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  char cVar5;
  long lVar6;
  pointer puVar7;
  pointer puVar8;
  uint uVar9;
  pointer puVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double Pso_ba;
  BSit it;
  BS newJB_unnorm;
  double local_d8;
  value_type local_d0;
  double local_c8;
  Index local_bc;
  undefined1 local_b8 [32];
  undefined1 *local_98;
  pointer local_90;
  undefined1 local_88 [88];
  undefined1 extraout_var [56];
  
  local_90 = *(pointer *)(&this->field_0x8 + *(long *)(*(long *)this + -0xd8));
  local_bc = newJOI;
  boost::numeric::ublas::
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::compressed_vector((compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                       *)(local_88 + 0x10),(size_type)local_90,0);
  cVar5 = (**(code **)((long)*pu + 0x140))(pu);
  local_98 = &this->field_0x8;
  local_c8 = 0.0;
  local_b8._24_8_ = this;
  for (uVar9 = 0; puVar10 = (pointer)(ulong)uVar9, puVar10 < local_90; uVar9 = uVar9 + 1) {
    local_d0 = 0.0;
    if (cVar5 == '\0') {
      boost::numeric::ublas::
      compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
      ::begin((compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
               *)local_b8);
      uVar4 = local_b8._0_8_;
      local_d8 = 0.0;
      puVar7 = (pointer)local_b8._8_8_;
      puVar8 = (pointer)local_b8._8_8_;
      while (boost::numeric::ublas::
             compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
             ::end((compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                    *)local_b8), puVar7 != (pointer)local_b8._8_8_) {
        auVar14._0_8_ = (**(code **)((long)*pu + 0x108))(pu,(int)*puVar7,lastJAI,puVar10);
        auVar14._8_56_ = extraout_var;
        auVar16._8_8_ = 0;
        auVar16._0_8_ = local_d8;
        puVar7 = puVar7 + 1;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = *(ulong *)(((long)((value_array_type *)(uVar4 + 0x30))->data_ -
                                  (long)((index_array_type *)(uVar4 + 0x18))->data_) + (long)puVar8)
        ;
        auVar3 = vfmadd231sd_fma(auVar16,auVar14._0_16_,auVar3);
        puVar8 = puVar8 + 1;
        local_d8 = auVar3._0_8_;
      }
      if (0.0 < local_d8) {
        local_d0 = (value_type)(**(code **)((long)*pu + 0x118))(pu,lastJAI,puVar10,local_bc);
        local_d0 = local_d0 * local_d8;
      }
    }
    else {
      boost::numeric::ublas::
      compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
      ::begin((compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
               *)local_b8);
      uVar4 = local_b8._0_8_;
      puVar7 = (pointer)local_b8._8_8_;
      puVar8 = (pointer)local_b8._8_8_;
      while (boost::numeric::ublas::
             compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
             ::end((compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                    *)local_b8), puVar7 != (pointer)local_b8._8_8_) {
        dVar11 = (double)(**(code **)((long)*pu + 0x120))(pu,(int)*puVar7,lastJAI,puVar10,local_bc);
        dVar12 = (double)(**(code **)((long)*pu + 0x108))(pu,(int)*puVar7,lastJAI,uVar9);
        puVar7 = puVar7 + 1;
        auVar15._8_8_ = 0;
        auVar15._0_8_ =
             *(ulong *)(((long)((value_array_type *)(uVar4 + 0x30))->data_ -
                        (long)((index_array_type *)(uVar4 + 0x18))->data_) + (long)puVar8);
        puVar8 = puVar8 + 1;
        auVar1._8_8_ = 0;
        auVar1._0_8_ = local_d0;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = dVar12 * dVar11;
        auVar3 = vfmadd213sd_fma(auVar15,auVar13,auVar1);
        local_d0 = auVar3._0_8_;
      }
    }
    this = (JointBeliefSparse *)local_b8._24_8_;
    if (1e-12 < local_d0) {
      local_b8._0_8_ = local_88 + 0x10;
      local_b8._8_8_ = puVar10;
      boost::numeric::ublas::
      sparse_vector_element<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
      ::set((sparse_vector_element<boost::numeric::ublas::compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>
             *)local_b8,&local_d0);
      local_c8 = local_c8 + local_d0;
    }
  }
  if (0.0 < local_c8) {
    boost::numeric::ublas::
    compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
    ::begin((compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
             *)local_b8);
    while (boost::numeric::ublas::
           compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
           ::end((compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                  *)local_88), local_b8._8_8_ != local_88._8_8_) {
      lVar6 = local_b8._8_8_ - (long)((index_array_type *)(local_b8._0_8_ + 0x18))->data_;
      pdVar2 = ((value_array_type *)(local_b8._0_8_ + 0x30))->data_;
      *(double *)((long)pdVar2 + lVar6) = *(double *)((long)pdVar2 + lVar6) / local_c8;
      local_b8._8_8_ = (pointer)(local_b8._8_8_ + 8);
    }
  }
  boost::numeric::ublas::
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::operator=((compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
               *)(&this->field_0x8 + *(long *)(*(long *)this + -0xd8)),
              (compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
               *)(local_88 + 0x10));
  boost::numeric::ublas::
  compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
  ::~compressed_vector
            ((compressed_vector<double,_0UL,_boost::numeric::ublas::unbounded_array<unsigned_long,_std::allocator<unsigned_long>_>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
              *)(local_88 + 0x10));
  return local_c8;
}

Assistant:

double JointBeliefSparse::UpdateSlow(const MultiAgentDecisionProcessDiscreteInterface &pu,
                                     Index lastJAI, Index newJOI)
{
    double Po_ba = 0.0; // P(o|b,a) with o=newJO
    double Ps_ba, Po_as, Pso_ba;
    size_t nrS = _m_b.size();
    BS newJB_unnorm(nrS);
    bool isEventDriven = pu.GetEventObservability();
    for(Index sI=0; sI < nrS; sI++)
    {
        Pso_ba = 0;
        
        if(!isEventDriven)
        {
            //P(sI | b, a) = sum_(prec_s) P(sI | prec_s, a)*JB(prec_s)
            Ps_ba = 0.0;

            for(BScit it=_m_b.begin(); it!=_m_b.end(); ++it)
                Ps_ba += pu.GetTransitionProbability(it.index(), lastJAI, sI) * *it;
            
            if(Ps_ba>0) // if it is zero, Pso_ba will be zero anyway
            {
                //P(newJOI | lastJAI, sI) :
                Po_as = pu.GetObservationProbability(lastJAI, sI, newJOI);

                //the new (unormalized) belief P(s,o|b,a)
                Pso_ba = Po_as * Ps_ba;
            }
        }
        else
        {
            for(BScit it=_m_b.begin(); it!=_m_b.end(); ++it)
                //P(sI, newJOI | b, a) = sum_(prec_s) P(newJOI | prec_sI, lastJAI, sI)*P(sI | prec_s, a)* JB(prec_s)
                Pso_ba += pu.GetObservationProbability(it.index(), lastJAI, sI, newJOI) * 
                          pu.GetTransitionProbability(it.index(), lastJAI, sI) * *it;
        }
        
        if(Pso_ba>PROB_PRECISION) // we don't want to store very
                                  // small probabilities in a
                                  // sparse representation
        {
            newJB_unnorm[sI]=Pso_ba; //unnormalized new belief
            Po_ba += Pso_ba; //running sum of P(o|b,a)
        }
    }
    
    //normalize:    
    if(Po_ba>0)
        for(BSit it=newJB_unnorm.begin(); it!=newJB_unnorm.end(); ++it)
            *it/=Po_ba;

    _m_b=newJB_unnorm;

#if JointBeliefSparse_doSanityCheckAfterEveryUpdate
    if(!SanityCheck())
        throw(E("JointBeliefSparse::UpdateSlow SanityCheck failed"));
#endif

    return(Po_ba);
}